

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

void target_make_prolog_epilog(gen_ctx_t gen_ctx,bitmap_t used_hard_regs,size_t stack_slots_num)

{
  MIR_context_t ctx_00;
  MIR_func_t pMVar1;
  int iVar2;
  MIR_insn_t before;
  MIR_insn_t_conflict pMVar3;
  size_t local_358;
  size_t local_348;
  MIR_op_t local_328;
  MIR_op_t local_2f8;
  MIR_op_t local_2c8;
  MIR_op_t local_298;
  MIR_op_t local_268;
  MIR_op_t local_238;
  MIR_op_t local_208;
  MIR_op_t local_1d8;
  MIR_op_t local_1a8;
  MIR_op_t local_178;
  MIR_op_t local_148;
  MIR_op_t local_118;
  ulong local_e8;
  size_t block_size;
  size_t stack_slots_size;
  size_t saved_hard_regs_size;
  size_t service_area_size;
  size_t i;
  int64_t offset;
  int64_t bp_saved_reg_offset;
  undefined1 auStack_a8 [4];
  MIR_reg_t base_reg;
  MIR_op_t fp_reg_op;
  MIR_op_t sp_reg_op;
  MIR_insn_t new_insn;
  MIR_insn_t anchor;
  MIR_func_t func;
  MIR_context_t ctx;
  size_t stack_slots_num_local;
  bitmap_t used_hard_regs_local;
  gen_ctx_t gen_ctx_local;
  
  ctx_00 = gen_ctx->ctx;
  if (gen_ctx->curr_func_item->item_type == MIR_func_item) {
    pMVar1 = (gen_ctx->curr_func_item->u).func;
    stack_slots_size = 0;
    for (service_area_size = 0; service_area_size < 0x10; service_area_size = service_area_size + 1)
    {
      iVar2 = target_call_used_hard_reg_p((MIR_reg_t)service_area_size,MIR_T_UNDEF);
      if ((iVar2 == 0) && (iVar2 = bitmap_bit_p(used_hard_regs,service_area_size), iVar2 != 0)) {
        stack_slots_size = stack_slots_size + 8;
      }
    }
    if ((((gen_ctx->target_ctx->leaf_p == '\0') || (gen_ctx->target_ctx->alloca_p != '\0')) ||
        (gen_ctx->target_ctx->block_arg_func_p != '\0')) ||
       (((stack_slots_size != 0 || (pMVar1->vararg_p != '\0')) || (stack_slots_num != 0)))) {
      before = DLIST_MIR_insn_t_head(&pMVar1->insns);
      _MIR_new_var_op(&local_118,ctx_00,4);
      memcpy((void *)((long)&fp_reg_op.u + 0x18),&local_118,0x30);
      if (gen_ctx->target_ctx->keep_fp_p != '\0') {
        _MIR_new_var_op(&local_148,ctx_00,5);
        memcpy(auStack_a8,&local_148,0x30);
        _MIR_new_var_mem_op(&local_178,ctx_00,MIR_T_I64,-8,4,0xffffffff,'\x01');
        pMVar3 = MIR_new_insn(ctx_00,MIR_MOV);
        gen_add_insn_before(gen_ctx,before,pMVar3);
        MIR_new_int_op(&local_1a8,ctx_00,-8);
        pMVar3 = MIR_new_insn(ctx_00,MIR_ADD);
        gen_add_insn_before(gen_ctx,before,pMVar3);
      }
      iVar2 = 0;
      if (pMVar1->vararg_p != '\0') {
        iVar2 = 0xb0;
      }
      saved_hard_regs_size = (size_t)iVar2;
      if (pMVar1->jret_p == '\0') {
        saved_hard_regs_size = saved_hard_regs_size + 8;
      }
      block_size = stack_slots_num * 8;
      if (gen_ctx->target_ctx->keep_fp_p == '\0') {
        block_size = block_size + 0xf & 0xfffffffffffffff0;
      }
      local_e8 = block_size + stack_slots_size + 0xf & 0xfffffffffffffff0;
      MIR_new_int_op(&local_1d8,ctx_00,local_e8 + saved_hard_regs_size);
      pMVar3 = MIR_new_insn(ctx_00,MIR_SUB);
      gen_add_insn_before(gen_ctx,before,pMVar3);
      offset = local_e8;
      if (pMVar1->vararg_p != '\0') {
        i = local_e8;
        isave(gen_ctx,before,(int)local_e8,7);
        isave(gen_ctx,before,(int)i + 8,6);
        isave(gen_ctx,before,(int)i + 0x10,2);
        isave(gen_ctx,before,(int)i + 0x18,1);
        isave(gen_ctx,before,(int)i + 0x20,8);
        isave(gen_ctx,before,(int)i + 0x28,9);
        dsave(gen_ctx,before,(int)i + 0x30,0x10);
        dsave(gen_ctx,before,(int)i + 0x40,0x11);
        dsave(gen_ctx,before,(int)i + 0x50,0x12);
        dsave(gen_ctx,before,(int)i + 0x60,0x13);
        dsave(gen_ctx,before,(int)i + 0x70,0x14);
        dsave(gen_ctx,before,(int)i + 0x80,0x15);
        dsave(gen_ctx,before,(int)i + 0x90,0x16);
        dsave(gen_ctx,before,(int)i + 0xa0,0x17);
        offset = offset + 0xb0;
      }
      if (gen_ctx->target_ctx->keep_fp_p == '\0') {
        local_348 = block_size;
      }
      else {
        local_348 = -offset;
      }
      i = local_348;
      bp_saved_reg_offset._4_4_ = 4;
      if (gen_ctx->target_ctx->keep_fp_p != '\0') {
        bp_saved_reg_offset._4_4_ = 5;
      }
      for (service_area_size = 0; service_area_size < 0x10;
          service_area_size = service_area_size + 1) {
        iVar2 = target_call_used_hard_reg_p((MIR_reg_t)service_area_size,MIR_T_UNDEF);
        if ((iVar2 == 0) && (iVar2 = bitmap_bit_p(used_hard_regs,service_area_size), iVar2 != 0)) {
          _MIR_new_var_mem_op(&local_208,ctx_00,MIR_T_I64,i,bp_saved_reg_offset._4_4_,0xffffffff,
                              '\x01');
          _MIR_new_var_op(&local_238,ctx_00,(MIR_reg_t)service_area_size);
          pMVar3 = MIR_new_insn(ctx_00,MIR_MOV);
          gen_add_insn_before(gen_ctx,before,pMVar3);
          i = i + 8;
        }
      }
      for (new_insn = DLIST_MIR_insn_t_tail(&pMVar1->insns);
          ((new_insn != (MIR_insn_t)0x0 && ((int)*(undefined8 *)&new_insn->field_0x18 != 0xab)) &&
          ((int)*(undefined8 *)&new_insn->field_0x18 != 0xac));
          new_insn = DLIST_MIR_insn_t_prev(new_insn)) {
      }
      if (new_insn != (MIR_insn_t)0x0) {
        if (gen_ctx->target_ctx->keep_fp_p == '\0') {
          local_358 = block_size;
        }
        else {
          local_358 = -offset;
        }
        i = local_358;
        for (service_area_size = 0; service_area_size < 0x10;
            service_area_size = service_area_size + 1) {
          iVar2 = target_call_used_hard_reg_p((MIR_reg_t)service_area_size,MIR_T_UNDEF);
          if ((iVar2 == 0) && (iVar2 = bitmap_bit_p(used_hard_regs,service_area_size), iVar2 != 0))
          {
            _MIR_new_var_op(&local_268,ctx_00,(MIR_reg_t)service_area_size);
            _MIR_new_var_mem_op(&local_298,ctx_00,MIR_T_I64,i,bp_saved_reg_offset._4_4_,0xffffffff,
                                '\x01');
            pMVar3 = MIR_new_insn(ctx_00,MIR_MOV);
            gen_add_insn_before(gen_ctx,new_insn,pMVar3);
            i = i + 8;
          }
        }
        if (gen_ctx->target_ctx->keep_fp_p == '\0') {
          MIR_new_int_op(&local_2c8,ctx_00,local_e8 + saved_hard_regs_size);
          pMVar3 = MIR_new_insn(ctx_00,MIR_ADD);
          gen_add_insn_before(gen_ctx,new_insn,pMVar3);
        }
        else {
          MIR_new_int_op(&local_2f8,ctx_00,8);
          pMVar3 = MIR_new_insn(ctx_00,MIR_ADD);
          gen_add_insn_before(gen_ctx,new_insn,pMVar3);
          _MIR_new_var_mem_op(&local_328,ctx_00,MIR_T_I64,-8,4,0xffffffff,'\x01');
          pMVar3 = MIR_new_insn(ctx_00,MIR_MOV);
          gen_add_insn_before(gen_ctx,new_insn,pMVar3);
        }
      }
    }
    return;
  }
  __assert_fail("curr_func_item->item_type == MIR_func_item",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x492,"void target_make_prolog_epilog(gen_ctx_t, bitmap_t, size_t)");
}

Assistant:

static void target_make_prolog_epilog (gen_ctx_t gen_ctx, bitmap_t used_hard_regs,
                                       size_t stack_slots_num) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_func_t func;
  MIR_insn_t anchor, new_insn;
  MIR_op_t sp_reg_op, fp_reg_op;
#ifdef MIR_NO_RED_ZONE_ABI
  MIR_op_t temp_reg_op;
#endif
  MIR_reg_t base_reg;
  int64_t bp_saved_reg_offset, offset;
  size_t i, service_area_size, saved_hard_regs_size, stack_slots_size, block_size;

  assert (curr_func_item->item_type == MIR_func_item);
  func = curr_func_item->u.func;
  for (i = saved_hard_regs_size = 0; i <= R15_HARD_REG; i++)
    if (!target_call_used_hard_reg_p ((MIR_reg_t) i, MIR_T_UNDEF)
        && bitmap_bit_p (used_hard_regs, i))
      saved_hard_regs_size += 8;
#ifdef _WIN32
  for (; i <= XMM15_HARD_REG; i++)
    if (!target_call_used_hard_reg_p ((MIR_reg_t) i, MIR_T_UNDEF)
        && bitmap_bit_p (used_hard_regs, i))
      saved_hard_regs_size += 16;
#endif
  if (leaf_p && !alloca_p && !block_arg_func_p && saved_hard_regs_size == 0 && !func->vararg_p
      && stack_slots_num == 0)
    return;
  anchor = DLIST_HEAD (MIR_insn_t, func->insns);
  sp_reg_op = _MIR_new_var_op (ctx, SP_HARD_REG);
  if (keep_fp_p) {
    fp_reg_op = _MIR_new_var_op (ctx, FP_HARD_REG);
#ifdef MIR_NO_RED_ZONE_ABI
    temp_reg_op = _MIR_new_var_op (ctx, TEMP_INT_HARD_REG1);
#endif
    /* Prologue: */
#ifdef MIR_NO_RED_ZONE_ABI
    new_insn = MIR_new_insn (ctx, MIR_ADD, temp_reg_op, sp_reg_op, MIR_new_int_op (ctx, -8));
    gen_add_insn_before (gen_ctx, anchor, new_insn); /* temp = sp - 8 */
#else
    new_insn = MIR_new_insn (ctx, MIR_MOV,
                             _MIR_new_var_mem_op (ctx, MIR_T_I64, -8, SP_HARD_REG, MIR_NON_VAR, 1),
                             fp_reg_op);
    gen_add_insn_before (gen_ctx, anchor, new_insn); /* -8(sp) = bp */
    /* Use add for matching LEA: */
    new_insn = MIR_new_insn (ctx, MIR_ADD, fp_reg_op, sp_reg_op, MIR_new_int_op (ctx, -8));
    gen_add_insn_before (gen_ctx, anchor, new_insn); /* bp = sp - 8 */
#endif
  }
#ifdef _WIN32
  if (func->vararg_p) { /* filling spill space */
    assert (keep_fp_p);
    for (i = 0, offset = 16 /* ret & bp */; i < 4; i++, offset += 8)
      gen_mov (gen_ctx, anchor, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_I64, offset, FP_HARD_REG, MIR_NON_VAR, 1),
               _MIR_new_var_op (ctx, get_int_arg_reg (i)));
  }
#endif
  service_area_size = func->vararg_p ? reg_save_area_size : 0;
  if (!func->jret_p) service_area_size += 8; /* return address */
  stack_slots_size = stack_slots_num * 8;
  if (!keep_fp_p) stack_slots_size = (stack_slots_size + 15) / 16 * 16;
  /* stack slots, and saved regs as multiple of 16 bytes: */
  block_size = (stack_slots_size + saved_hard_regs_size + 15) / 16 * 16;
  new_insn = MIR_new_insn (ctx, MIR_SUB, sp_reg_op, sp_reg_op,
                           MIR_new_int_op (ctx, block_size + service_area_size));
  gen_add_insn_before (gen_ctx, anchor, new_insn); /* sp -= block size + service_area_size */
  bp_saved_reg_offset = block_size;
#ifdef MIR_NO_RED_ZONE_ABI
  if (keep_fp_p) {
    new_insn
      = MIR_new_insn (ctx, MIR_MOV,
                      _MIR_new_var_mem_op (ctx, MIR_T_I64, block_size + service_area_size - 8,
                                           SP_HARD_REG, MIR_NON_VAR, 1),
                      fp_reg_op);
    gen_add_insn_before (gen_ctx, anchor, new_insn); /* -8(old sp) = bp */
    new_insn = MIR_new_insn (ctx, MIR_MOV, fp_reg_op, temp_reg_op);
    gen_add_insn_before (gen_ctx, anchor, new_insn); /* bp = temp */
  }
#endif
#ifndef _WIN32
  if (func->vararg_p) {
    offset = block_size;
    isave (gen_ctx, anchor, offset, DI_HARD_REG);
    isave (gen_ctx, anchor, offset + 8, SI_HARD_REG);
    isave (gen_ctx, anchor, offset + 16, DX_HARD_REG);
    isave (gen_ctx, anchor, offset + 24, CX_HARD_REG);
    isave (gen_ctx, anchor, offset + 32, R8_HARD_REG);
    isave (gen_ctx, anchor, offset + 40, R9_HARD_REG);
    dsave (gen_ctx, anchor, offset + 48, XMM0_HARD_REG);
    dsave (gen_ctx, anchor, offset + 64, XMM1_HARD_REG);
    dsave (gen_ctx, anchor, offset + 80, XMM2_HARD_REG);
    dsave (gen_ctx, anchor, offset + 96, XMM3_HARD_REG);
    dsave (gen_ctx, anchor, offset + 112, XMM4_HARD_REG);
    dsave (gen_ctx, anchor, offset + 128, XMM5_HARD_REG);
    dsave (gen_ctx, anchor, offset + 144, XMM6_HARD_REG);
    dsave (gen_ctx, anchor, offset + 160, XMM7_HARD_REG);
    bp_saved_reg_offset += reg_save_area_size;
  }
#endif
  /* Saving callee saved hard registers: */
  offset = keep_fp_p ? -bp_saved_reg_offset : (int64_t) stack_slots_size;
  base_reg = keep_fp_p ? FP_HARD_REG : SP_HARD_REG;
#ifdef _WIN32
  for (i = XMM0_HARD_REG; i <= XMM15_HARD_REG; i++)
    if (!target_call_used_hard_reg_p ((MIR_reg_t) i, MIR_T_UNDEF)
        && bitmap_bit_p (used_hard_regs, i)) {
      new_insn = _MIR_new_unspec_insn (ctx, 3, MIR_new_int_op (ctx, MOVDQA_CODE),
                                       _MIR_new_var_mem_op (ctx, MIR_T_D, offset, base_reg,
                                                            MIR_NON_VAR, 1),
                                       _MIR_new_var_op (ctx, (MIR_reg_t) i));
      gen_add_insn_before (gen_ctx, anchor, new_insn); /* disp(bp|sp) = saved hard reg */
      offset += 16;
    }
#endif
  for (i = 0; i <= R15_HARD_REG; i++)
    if (!target_call_used_hard_reg_p ((MIR_reg_t) i, MIR_T_UNDEF)
        && bitmap_bit_p (used_hard_regs, i)) {
      new_insn
        = MIR_new_insn (ctx, MIR_MOV,
                        _MIR_new_var_mem_op (ctx, MIR_T_I64, offset, base_reg, MIR_NON_VAR, 1),
                        _MIR_new_var_op (ctx, (MIR_reg_t) i));
      gen_add_insn_before (gen_ctx, anchor, new_insn); /* disp(bp|sp) = saved hard reg */
      offset += 8;
    }
  /* Epilogue: */
  for (anchor = DLIST_TAIL (MIR_insn_t, func->insns); anchor != NULL;
       anchor = DLIST_PREV (MIR_insn_t, anchor))
    if (anchor->code == MIR_RET || anchor->code == MIR_JRET) break;
  if (anchor == NULL) return;
  /* Restoring hard registers: */
  offset = keep_fp_p ? -bp_saved_reg_offset : (int64_t) stack_slots_size;
#ifdef _WIN32
  for (i = XMM0_HARD_REG; i <= XMM15_HARD_REG; i++)
    if (!target_call_used_hard_reg_p ((MIR_reg_t) i, MIR_T_UNDEF)
        && bitmap_bit_p (used_hard_regs, i)) {
      new_insn = _MIR_new_unspec_insn (ctx, 3, MIR_new_int_op (ctx, MOVDQA_CODE),
                                       _MIR_new_var_op (ctx, (MIR_reg_t) i),
                                       _MIR_new_var_mem_op (ctx, MIR_T_D, offset, base_reg,
                                                            MIR_NON_VAR, 1));
      gen_add_insn_before (gen_ctx, anchor, new_insn); /* hard reg = disp(bp|sp) */
      offset += 16;
    }
#endif
  for (i = 0; i <= R15_HARD_REG; i++)
    if (!target_call_used_hard_reg_p ((MIR_reg_t) i, MIR_T_UNDEF)
        && bitmap_bit_p (used_hard_regs, i)) {
      new_insn
        = MIR_new_insn (ctx, MIR_MOV, _MIR_new_var_op (ctx, (MIR_reg_t) i),
                        _MIR_new_var_mem_op (ctx, MIR_T_I64, offset, base_reg, MIR_NON_VAR, 1));
      gen_add_insn_before (gen_ctx, anchor, new_insn); /* hard reg = disp(bp|sp) */
      offset += 8;
    }
  if (!keep_fp_p) {
    new_insn = MIR_new_insn (ctx, MIR_ADD, sp_reg_op, sp_reg_op,
                             MIR_new_int_op (ctx, block_size + service_area_size));
    gen_add_insn_before (gen_ctx, anchor, new_insn); /* sp += block size + service_area_size */
  } else {
#ifdef MIR_NO_RED_ZONE_ABI
    new_insn = MIR_new_insn (ctx, MIR_MOV, temp_reg_op, fp_reg_op);
    gen_add_insn_before (gen_ctx, anchor, new_insn); /* temp = bp */
    new_insn
      = MIR_new_insn (ctx, MIR_MOV, fp_reg_op,
                      _MIR_new_var_mem_op (ctx, MIR_T_I64, 0, TEMP_INT_HARD_REG1, MIR_NON_VAR, 1));
    gen_add_insn_before (gen_ctx, anchor, new_insn); /* bp = 0(bp) */
    new_insn = MIR_new_insn (ctx, MIR_ADD, sp_reg_op, temp_reg_op, MIR_new_int_op (ctx, 8));
    gen_add_insn_before (gen_ctx, anchor, new_insn); /* sp = temp + 8 */
#else
    new_insn = MIR_new_insn (ctx, MIR_ADD, sp_reg_op, fp_reg_op, MIR_new_int_op (ctx, 8));
    gen_add_insn_before (gen_ctx, anchor, new_insn); /* sp = bp + 8 */
    new_insn = MIR_new_insn (ctx, MIR_MOV, fp_reg_op,
                             _MIR_new_var_mem_op (ctx, MIR_T_I64, -8, SP_HARD_REG, MIR_NON_VAR, 1));
    gen_add_insn_before (gen_ctx, anchor, new_insn); /* bp = -8(sp) */
#endif
  }
}